

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

void __thiscall lest::got_none::got_none(got_none *this,location *where_,text *expr_)

{
  allocator local_ea;
  allocator local_e9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  size_type local_e0;
  char local_d8 [8];
  undefined8 uStack_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  size_type local_c0;
  char local_b8 [8];
  undefined8 uStack_b0;
  text local_a8;
  text local_88;
  text local_68;
  location local_48;
  
  std::__cxx11::string::string((string *)&local_c8,"passed: got no exception",&local_e9);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  if (local_c8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8) {
    local_a8.field_2._8_8_ = uStack_b0;
  }
  else {
    local_a8._M_dataplus._M_p = (pointer)local_c8;
  }
  local_a8._M_string_length = local_c0;
  local_c0 = 0;
  local_b8[0] = '\0';
  local_c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_b8;
  location::location(&local_48,where_);
  std::__cxx11::string::string((string *)&local_68,(string *)expr_);
  std::__cxx11::string::string((string *)&local_e8,"",&local_ea);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  if (local_e8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8) {
    local_88.field_2._8_8_ = uStack_d0;
  }
  else {
    local_88._M_dataplus._M_p = (pointer)local_e8;
  }
  local_88._M_string_length = local_e0;
  local_e0 = 0;
  local_d8[0] = '\0';
  local_e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_d8;
  success::success(&this->super_success,&local_a8,&local_48,&local_68,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  *(undefined ***)&(this->super_success).super_message = &PTR__message_001b2c98;
  return;
}

Assistant:

got_none( location where_, text expr_)
    : success( "passed: got no exception", where_, expr_) {}